

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver_test.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::anon_unknown_0::
NameResolverTest_NestInFileClassServiceEdition2024_Test::TestBody
          (NameResolverTest_NestInFileClassServiceEdition2024_Test *this)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  ServiceDescriptor *descriptor;
  char *pcVar3;
  AssertHelper local_248;
  Message local_240;
  string local_238;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_3;
  Message local_200;
  string local_1f8;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_2;
  Message local_1c0;
  string local_1b8;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_1;
  Message local_180;
  string local_178;
  undefined1 local_158 [8];
  AssertionResult gtest_ar;
  ServiceDescriptor *unnested_service;
  ServiceDescriptor *local_120;
  ServiceDescriptor *nested_service;
  FileDescriptor *local_108;
  FileDescriptor *file;
  Options local_f0;
  undefined1 local_a0 [8];
  ClassNameResolver resolver;
  string_view local_20;
  NameResolverTest_NestInFileClassServiceEdition2024_Test *local_10;
  NameResolverTest_NestInFileClassServiceEdition2024_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,"foo.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             ((long)&resolver.file_immutable_outer_class_names_.
                     super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     .
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     .settings_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
             + 0x18),
             "\n      edition = \"2024\";\n      import \"third_party/java/protobuf/java_features.proto\";\n      package proto2_unittest;\n      option java_generic_services = true;\n      message Dummy {}\n      service NestedInFileClassService {\n        option features.(pb.java).nest_in_file_class = YES;\n        rpc Method(Dummy) returns (Dummy) {}\n      }\n      service UnnestedService {\n        rpc Method(Dummy) returns (Dummy) {}\n      }\n                "
            );
  NameResolverTest::BuildFileAndPopulatePool
            (&this->super_NameResolverTest,local_20,stack0xffffffffffffffd0);
  Options::Options(&local_f0);
  ClassNameResolver::ClassNameResolver((ClassNameResolver *)local_a0,&local_f0);
  Options::~Options(&local_f0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&nested_service,"foo.proto");
  pFVar2 = DescriptorPool::FindFileByName(&(this->super_NameResolverTest).pool_,_nested_service);
  local_108 = pFVar2;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&unnested_service,
             "NestedInFileClassService");
  local_120 = FileDescriptor::FindServiceByName(pFVar2,_unnested_service);
  pFVar2 = local_108;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,
             "UnnestedService");
  descriptor = FileDescriptor::FindServiceByName(pFVar2,stack0xfffffffffffffeb8);
  ClassNameResolver::GetClassName_abi_cxx11_
            (&local_178,(ClassNameResolver *)local_a0,descriptor,true);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[32],_nullptr>
            ((EqHelper *)local_158,"resolver.GetClassName(unnested_service, true)",
             "\"\" \"proto2_unittest.UnnestedService\"",&local_178,
             (char (*) [32])"proto2_unittest.UnnestedService");
  std::__cxx11::string::~string((string *)&local_178);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0xd7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  ClassNameResolver::GetClassName_abi_cxx11_
            (&local_1b8,(ClassNameResolver *)local_a0,local_120,true);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[50],_nullptr>
            ((EqHelper *)local_198,"resolver.GetClassName(nested_service, true)",
             "\"\" \"proto2_unittest.FooProto.NestedInFileClassService\"",&local_1b8,
             (char (*) [50])"proto2_unittest.FooProto.NestedInFileClassService");
  std::__cxx11::string::~string((string *)&local_1b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0xda,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  ClassNameResolver::GetJavaImmutableClassName_abi_cxx11_
            (&local_1f8,(ClassNameResolver *)local_a0,descriptor);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[32],_nullptr>
            ((EqHelper *)local_1d8,"resolver.GetJavaImmutableClassName(unnested_service)",
             "\"\" \"proto2_unittest.UnnestedService\"",&local_1f8,
             (char (*) [32])"proto2_unittest.UnnestedService");
  std::__cxx11::string::~string((string *)&local_1f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0xdc,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  ClassNameResolver::GetJavaImmutableClassName_abi_cxx11_
            (&local_238,(ClassNameResolver *)local_a0,local_120);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[50],_nullptr>
            ((EqHelper *)local_218,"resolver.GetJavaImmutableClassName(nested_service)",
             "\"\" \"proto2_unittest.FooProto$NestedInFileClassService\"",&local_238,
             (char (*) [50])"proto2_unittest.FooProto$NestedInFileClassService");
  std::__cxx11::string::~string((string *)&local_238);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(&local_240);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
    testing::internal::AssertHelper::AssertHelper
              (&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0xde,pcVar3);
    testing::internal::AssertHelper::operator=(&local_248,&local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_248);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  ClassNameResolver::~ClassNameResolver((ClassNameResolver *)local_a0);
  return;
}

Assistant:

TEST_F(NameResolverTest, NestInFileClassServiceEdition2024) {
  BuildFileAndPopulatePool("foo.proto",
                           R"schema(
      edition = "2024";
      import "third_party/java/protobuf/java_features.proto";
      package proto2_unittest;
      option java_generic_services = true;
      message Dummy {}
      service NestedInFileClassService {
        option features.(pb.java).nest_in_file_class = YES;
        rpc Method(Dummy) returns (Dummy) {}
      }
      service UnnestedService {
        rpc Method(Dummy) returns (Dummy) {}
      }
                )schema");
  ClassNameResolver resolver;
  auto file = pool_.FindFileByName("foo.proto");
  auto nested_service = file->FindServiceByName("NestedInFileClassService");
  auto unnested_service = file->FindServiceByName("UnnestedService");

  EXPECT_EQ(resolver.GetClassName(unnested_service,
                                  /* immutable = */ true),
            PACKAGE_PREFIX "proto2_unittest.UnnestedService");
  EXPECT_EQ(resolver.GetClassName(nested_service,
                                  /* immutable = */ true),
            PACKAGE_PREFIX "proto2_unittest.FooProto.NestedInFileClassService");
  EXPECT_EQ(resolver.GetJavaImmutableClassName(unnested_service),
            PACKAGE_PREFIX "proto2_unittest.UnnestedService");
  EXPECT_EQ(resolver.GetJavaImmutableClassName(nested_service),
            PACKAGE_PREFIX "proto2_unittest.FooProto$NestedInFileClassService");
}